

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCapsuleShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbtCapsuleShape::localGetSupportingVertexWithoutMargin(cbtCapsuleShape *this,cbtVector3 *vec0)

{
  cbtScalar cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  cbtVector3 cVar16;
  ulong local_28;
  ulong uStack_20;
  cbtVector3 local_18;
  undefined1 extraout_var [60];
  
  local_18.m_floats._0_8_ = *(undefined8 *)vec0->m_floats;
  local_18.m_floats._8_8_ = *(undefined8 *)(vec0->m_floats + 2);
  auVar8._0_4_ = cbtVector3::length2(&local_18);
  auVar8._4_60_ = extraout_var;
  if (0.0001 <= auVar8._0_4_) {
    if (auVar8._0_4_ < 0.0) {
      fVar6 = sqrtf(auVar8._0_4_);
    }
    else {
      auVar10 = vsqrtss_avx(auVar8._0_16_,auVar8._0_16_);
      fVar6 = auVar10._0_4_;
    }
    fVar6 = 1.0 / fVar6;
    auVar10 = ZEXT416((uint)(fVar6 * local_18.m_floats[0]));
    fVar12 = fVar6 * local_18.m_floats[1];
    auVar11 = ZEXT416((uint)(fVar6 * local_18.m_floats[2]));
  }
  else {
    auVar10 = SUB6416(ZEXT464(0x3f800000),0);
    auVar11 = ZEXT816(0) << 0x40;
    fVar12 = 0.0;
  }
  local_28 = 0;
  uStack_20 = 0;
  lVar4 = (long)*(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  cVar1 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[lVar4];
  *(cbtScalar *)((long)&local_28 + lVar4 * 4) = cVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_28;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uStack_20;
  auVar2 = vmovshdup_avx(auVar5);
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ * fVar12)),auVar10,auVar5);
  auVar2 = vfmadd231ss_fma(auVar2,auVar11,auVar15);
  uVar13 = local_28;
  uVar14 = uStack_20;
  if (auVar2._0_4_ <= -1e+18) {
    uVar13 = 0;
    uVar14 = 0;
  }
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(ZEXT416((uint)cVar1),auVar3);
  local_28 = 0;
  uStack_20 = 0;
  auVar2 = vmaxss_avx(auVar2,SUB6416(ZEXT464(0xdd5e0b6b),0));
  *(int *)((long)&local_28 + lVar4 * 4) = auVar5._0_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_28;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uStack_20;
  auVar5 = vmovshdup_avx(auVar7);
  auVar10 = vfmadd213ss_fma(auVar10,auVar7,ZEXT416((uint)(auVar5._0_4_ * fVar12)));
  auVar10 = vfmadd213ss_fma(auVar11,auVar9,auVar10);
  if (auVar10._0_4_ <= auVar2._0_4_) {
    local_28 = uVar13;
    uStack_20 = uVar14;
  }
  cVar16.m_floats[2] = (cbtScalar)(int)uStack_20;
  cVar16.m_floats[3] = (cbtScalar)(int)(uStack_20 >> 0x20);
  cVar16.m_floats[0] = (cbtScalar)(int)local_28;
  cVar16.m_floats[1] = (cbtScalar)(int)(local_28 >> 0x20);
  return (cbtVector3)cVar16.m_floats;
}

Assistant:

cbtVector3 cbtCapsuleShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0) const
{
	cbtVector3 supVec(0, 0, 0);

	cbtScalar maxDot(cbtScalar(-BT_LARGE_FLOAT));

	cbtVector3 vec = vec0;
	cbtScalar lenSqr = vec.length2();
	if (lenSqr < cbtScalar(0.0001))
	{
		vec.setValue(1, 0, 0);
	}
	else
	{
		cbtScalar rlen = cbtScalar(1.) / cbtSqrt(lenSqr);
		vec *= rlen;
	}

	cbtVector3 vtx;
	cbtScalar newDot;

	{
		cbtVector3 pos(0, 0, 0);
		pos[getUpAxis()] = getHalfHeight();

		vtx = pos;
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}
	{
		cbtVector3 pos(0, 0, 0);
		pos[getUpAxis()] = -getHalfHeight();

		vtx = pos;
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}

	return supVec;
}